

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  sqlite3_io_methods *psVar2;
  PCache *pCache;
  sqlite3_file *psVar3;
  uint uVar4;
  long lVar5;
  u8 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Btree *p;
  BtShared *__s;
  size_t sVar10;
  undefined7 uVar17;
  char *pcVar11;
  Pager *pPVar12;
  ulong uVar13;
  sqlite3_mutex *psVar14;
  sqlite3_mutex *psVar15;
  void *pvVar16;
  Btree **ppBVar18;
  code *pcVar19;
  Btree *pBVar20;
  uint uVar21;
  undefined8 extraout_RDX;
  long lVar22;
  Btree *pBVar23;
  int iVar24;
  uint uVar25;
  Btree *pBVar26;
  Btree *pBVar27;
  ulong __n;
  u64 n;
  char *pcVar28;
  byte bVar29;
  bool bVar30;
  bool bVar31;
  u32 szPageDflt;
  uchar zDbHeader [100];
  sqlite3_mutex *local_118;
  char *local_110;
  u32 local_fc;
  char *local_f8;
  uint local_ec;
  size_t local_e8;
  sqlite3 *local_e0;
  char *local_d8;
  uint local_cc;
  undefined8 local_c8;
  char *local_c0;
  Btree **local_b8;
  uint local_ac;
  size_t local_a8;
  uint local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  ppBVar18 = ppBtree;
  local_f8 = zFilename;
  local_e0 = db;
  if (zFilename == (char *)0x0) {
LAB_0012bb0d:
    bVar30 = true;
    if (local_e0->temp_store != '\x02') goto LAB_0012bb28;
LAB_0012bb1b:
    local_ec = flags | 2;
    local_cc = (uint)CONCAT71((int7)((ulong)ppBVar18 >> 8),1);
  }
  else {
    cVar1 = *zFilename;
    bVar30 = cVar1 == '\0';
    iVar7 = strcmp(zFilename,":memory:");
    if (iVar7 == 0) goto LAB_0012bb1b;
    if (cVar1 == '\0') goto LAB_0012bb0d;
    bVar30 = false;
LAB_0012bb28:
    local_cc = (vfsFlags & 0x80U) >> 7;
    local_ec = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar8 = vfsFlags & 0xfffffcffU | 0x200;
  if ((char)local_cc == '\0' && !bVar30) {
    uVar8 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar8 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  uVar21 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->pPrev = (Btree *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->nBackup = 0;
  p->iBDataVersion = 0;
  p->pNext = (Btree *)0x0;
  p->pBt = (BtShared *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->hasIncrblobCur = '\0';
  p->wantToLock = 0;
  p->db = local_e0;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  local_b8 = ppBtree;
  if ((!bVar30) && ((uVar8 >> 0x11 & 1) != 0 && ((uVar8 & 0x40) == 0 & (byte)local_cc) == 0)) {
    if (local_f8 == (char *)0x0) {
      uVar9 = 1;
    }
    else {
      sVar10 = strlen(local_f8);
      uVar9 = ((uint)sVar10 & 0x3fffffff) + 1;
    }
    uVar25 = pVfs->mxPathname + 1;
    uVar4 = uVar9;
    if ((int)uVar9 < (int)uVar25) {
      uVar4 = uVar25;
    }
    pcVar28 = (char *)sqlite3Malloc((ulong)uVar4);
    p->sharable = '\x01';
    if (pcVar28 == (char *)0x0) {
LAB_0012c1ce:
      sqlite3_free(p);
      return uVar21;
    }
    if ((byte)local_cc == '\0') {
      *pcVar28 = '\0';
      uVar21 = (*pVfs->xFullPathname)(pVfs,local_f8,uVar25,pcVar28);
      if ((uVar21 & 0xfffffdff) != 0) {
        sqlite3_free(pcVar28);
        goto LAB_0012c1ce;
      }
    }
    else {
      memcpy(pcVar28,local_f8,(ulong)uVar9);
    }
    bVar30 = true;
    if (sqlite3Config.bCoreMutex == '\0') {
      psVar14 = (sqlite3_mutex *)0x0;
      bVar31 = true;
      local_118 = (sqlite3_mutex *)0x0;
    }
    else {
      local_118 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      bVar31 = local_118 == (sqlite3_mutex *)0x0;
      if (!bVar31) {
        (*sqlite3Config.mutex.xMutexEnter)(local_118);
      }
      if ((sqlite3Config.bCoreMutex == '\0') ||
         (psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar14 == (sqlite3_mutex *)0x0)) {
        psVar14 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar14);
        bVar30 = false;
      }
    }
    __s = sqlite3SharedCacheList;
    if (sqlite3SharedCacheList != (BtShared *)0x0) {
LAB_0012c17b:
      pPVar12 = __s->pPager;
      iVar7 = strcmp(pcVar28,pPVar12->zFilename);
      if ((iVar7 != 0) || (pPVar12->pVfs != pVfs)) goto LAB_0012c1a0;
      lVar22 = (long)local_e0->nDb;
      if (0 < lVar22) {
        uVar13 = lVar22 + 1;
        ppBVar18 = &local_e0->aDb[lVar22 + -1].pBt;
        do {
          if ((*ppBVar18 != (Btree *)0x0) && ((*ppBVar18)->pBt == __s)) {
            if (!bVar30) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar14);
            }
            if (!bVar31) {
              (*sqlite3Config.mutex.xMutexLeave)(local_118);
            }
            sqlite3_free(pcVar28);
            sqlite3_free(p);
            return 0x13;
          }
          uVar13 = uVar13 - 1;
          ppBVar18 = ppBVar18 + -4;
        } while (1 < uVar13);
      }
      p->pBt = __s;
      __s->nRef = __s->nRef + 1;
      goto LAB_0012c289;
    }
    __s = (BtShared *)0x0;
    goto LAB_0012c289;
  }
  local_118 = (sqlite3_mutex *)0x0;
LAB_0012bbd3:
  local_88 = 0;
  __s = (BtShared *)sqlite3Malloc(0x98);
  if (__s == (BtShared *)0x0) {
    uVar8 = 7;
  }
  else {
    memset(__s,0,0x98);
    pcVar28 = local_f8;
    local_fc = 0x1000;
    iVar7 = 0x50;
    if (0x50 < pVfs->szOsFile) {
      iVar7 = pVfs->szOsFile;
    }
    __s->pPager = (Pager *)0x0;
    local_ac = local_ec & 2;
    iVar24 = 1;
    if (local_ac == 0) {
      if (local_f8 == (char *)0x0) {
        local_e8 = 1;
        local_c0 = (char *)0x0;
        local_c8 = 0;
        local_110 = (char *)0x0;
        local_d8 = (char *)0x0;
        uVar21 = 0;
        goto LAB_0012bf4c;
      }
      if (*local_f8 == '\0') {
        local_e8 = 0;
        local_c0 = local_f8;
        local_c8 = 0;
        goto LAB_0012bf38;
      }
      iVar24 = pVfs->mxPathname;
      local_110 = (char *)sqlite3Malloc((long)iVar24 * 2 + 2);
      if (local_110 == (char *)0x0) goto LAB_0012c7d3;
      *local_110 = '\0';
      uVar9 = (*pVfs->xFullPathname)(pVfs,pcVar28,iVar24 + 1,local_110);
      uVar21 = (int)(uVar8 << 7) >> 0x1f & 0x60e;
      if (uVar9 != 0x200) {
        uVar21 = uVar9;
      }
      local_e8 = strlen(local_110);
      pcVar28 = local_f8;
      sVar10 = strlen(local_f8);
      uVar9 = (uint)sVar10 & 0x3fffffff;
      pcVar11 = pcVar28 + (ulong)uVar9 + 1;
      local_d8 = pcVar11;
      if (*pcVar11 == '\0') {
        iVar24 = uVar9 + (int)pcVar28;
      }
      else {
        do {
          sVar10 = strlen(pcVar11);
          pcVar28 = pcVar11 + sVar10;
          sVar10 = strlen(pcVar11 + sVar10 + 1);
          pcVar11 = pcVar28 + sVar10 + 2;
        } while (*pcVar11 != '\0');
        iVar24 = (int)sVar10 + (int)pcVar28 + 1;
      }
      if (uVar21 == 0) {
        uVar21 = (uint)local_e8 & 0x3fffffff;
        if ((int)(uVar21 + 8) <= pVfs->mxPathname) {
          iVar24 = (iVar24 - (int)local_d8) + 2;
          local_e8 = 0;
          local_c0 = local_f8;
          local_c8 = 0;
          goto LAB_0012bf4c;
        }
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xf1c9,
                    "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
        uVar21 = 0xe;
      }
LAB_0012c22d:
      uVar8 = uVar21;
      sqlite3_free(local_110);
    }
    else if (local_f8 == (char *)0x0) {
      local_c8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      local_c0 = (char *)0x0;
      local_e8 = 1;
LAB_0012bf38:
      local_110 = (char *)0x0;
      uVar21 = 0;
      local_d8 = (char *)0x0;
LAB_0012bf4c:
      uVar13 = (ulong)(iVar7 + 7U & 0x7ffffff8);
      __n = (ulong)uVar21;
      local_a8 = (size_t)iVar24;
      n = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) + __n * 3 + uVar13 * 2 + local_a8 + 0x1a6
      ;
      pPVar12 = (Pager *)sqlite3Malloc(n);
      if (pPVar12 == (Pager *)0x0) {
        uVar8 = 7;
        uVar21 = 7;
        if (local_110 != (char *)0x0) goto LAB_0012c22d;
        goto LAB_0012c7d9;
      }
      memset(pPVar12,0,n);
      pPVar12->pPCache = (PCache *)(pPVar12 + 1);
      pPVar12->fd = (sqlite3_file *)&pPVar12[1].jfd;
      lVar22 = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x38;
      pcVar11 = pPVar12[1].dbFileVers + lVar22;
      pPVar12->sjfd = (sqlite3_file *)pcVar11;
      pcVar11 = pcVar11 + uVar13;
      pPVar12->jfd = (sqlite3_file *)pcVar11;
      pcVar28 = pcVar11 + uVar13 + 0xc;
      *(Pager **)(pcVar11 + uVar13) = pPVar12;
      pPVar12->zFilename = pcVar28;
      if (__n == 0) {
        pPVar12->zJournal = (char *)0x0;
        pPVar12->zWal = (char *)0x0;
      }
      else {
        memcpy(pcVar28,local_110,__n);
        if (local_d8 == (char *)0x0) {
          lVar5 = __n + 2;
        }
        else {
          memcpy(pcVar28 + __n + 1,local_d8,local_a8);
          lVar5 = local_a8 + __n + 1;
        }
        pcVar28 = pcVar28 + lVar5;
        pPVar12->zJournal = pcVar28;
        memcpy(pcVar28,local_110,__n);
        pcVar28 = pcVar28 + __n;
        *(undefined8 *)pcVar28 = 0x6c616e72756f6a2d;
        pPVar12->zWal = pcVar28 + 9;
        memcpy(pcVar28 + 9,local_110,__n);
        builtin_strncpy(pPVar12[1].dbFileVers + __n * 2 + lVar5 + uVar13 + uVar13 + lVar22 + 0x15,
                        "-wal",4);
        if (local_110 != (char *)0x0) {
          sqlite3_free(local_110);
        }
      }
      pPVar12->pVfs = pVfs;
      pPVar12->vfsFlags = uVar8;
      uVar21 = 0;
      if (((char)local_e8 == '\0') && (uVar21 = 0, *local_c0 != '\0')) {
        local_9c = 0;
        uVar8 = (*pVfs->xOpen)(pVfs,pPVar12->zFilename,pPVar12->fd,uVar8 & 0x1087f7f,
                               (int *)&local_9c);
        uVar21 = local_9c >> 7 & 1;
        pPVar12->memVfs = (u8)uVar21;
        if (uVar8 == 0) {
          uVar8 = local_9c & 1;
          bVar29 = (byte)uVar8;
          psVar2 = pPVar12->fd->pMethods;
          if (psVar2 == (sqlite3_io_methods *)0x0) {
            bVar30 = true;
          }
          else {
            uVar9 = (*psVar2->xDeviceCharacteristics)(pPVar12->fd);
            bVar30 = (uVar9 >> 0xd & 1) == 0;
          }
          if (uVar8 == 0) {
            setSectorSize(pPVar12);
            uVar8 = pPVar12->sectorSize;
            if ((local_fc < uVar8) && (local_fc = uVar8, 0x2000 < uVar8)) {
              local_fc = 0x2000;
            }
          }
          iVar7 = sqlite3_uri_boolean(pPVar12->zFilename,"nolock",0);
          pPVar12->noLock = (u8)iVar7;
          if ((!bVar30) ||
             (iVar7 = sqlite3_uri_boolean(pPVar12->zFilename,"immutable",0), iVar7 != 0)) {
            uVar8 = 1;
            goto LAB_0012c431;
          }
          uVar6 = '\0';
          goto LAB_0012c442;
        }
      }
      else {
LAB_0012c431:
        pPVar12->eState = '\x01';
        pPVar12->eLock = '\x04';
        pPVar12->noLock = '\x01';
        bVar29 = (byte)uVar8 & 1;
        uVar6 = '\x01';
LAB_0012c442:
        uVar8 = sqlite3PagerSetPagesize(pPVar12,&local_fc,-1);
        uVar9 = local_ac;
        if (uVar8 == 0) {
          pcVar19 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          if (local_ac == 0) {
            pcVar19 = pagerStress;
          }
          pCache = pPVar12->pPCache;
          pCache->szCache = 0;
          pCache->szSpill = 0;
          pCache->szPage = 0;
          pCache->szExtra = 0;
          pCache->bPurgeable = '\0';
          pCache->eCreate = '\0';
          *(undefined6 *)&pCache->field_0x32 = 0;
          pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          pCache->pStress = (void *)0x0;
          pCache->pCache = (sqlite3_pcache *)0x0;
          pCache->pSynced = (PgHdr *)0x0;
          pCache->nRefSum = 0;
          pCache->pDirty = (PgHdr *)0x0;
          pCache->pDirtyTail = (PgHdr *)0x0;
          pCache->szPage = 1;
          pCache->szExtra = 0x88;
          pCache->bPurgeable = (byte)(local_ac >> 1) ^ 1;
          pCache->eCreate = '\x02';
          pCache->xStress = pcVar19;
          pCache->pStress = pPVar12;
          pCache->szCache = 100;
          pCache->szSpill = 1;
          uVar8 = sqlite3PcacheSetPageSize(pCache,local_fc);
          if (uVar8 == 0) {
            uVar8 = local_ec & 1;
            pPVar12->useJournal = (byte)uVar8 ^ 1;
            pPVar12->mxPgno = 0xfffffffe;
            pPVar12->tempFile = uVar6;
            pPVar12->exclusiveMode = uVar6;
            pPVar12->changeCountDone = uVar6;
            pPVar12->memDb = (u8)local_c8;
            pPVar12->readOnly = bVar29;
            sqlite3PagerSetFlags(pPVar12,0x23);
            pPVar12->nExtra = 0x88;
            pPVar12->journalSizeLimit = -1;
            setSectorSize(pPVar12);
            uVar6 = '\x02';
            if ((uVar8 != 0) || (uVar6 = '\x04', uVar9 != 0 || uVar21 != 0)) {
              pPVar12->journalMode = uVar6;
            }
            pPVar12->xReiniter = pageReinit;
            if (pPVar12->errCode == 0) {
              if (pPVar12->bUseFetch == '\0') {
                pcVar19 = getPageNormal;
              }
              else {
                pcVar19 = getPageMMap;
              }
            }
            else {
              pcVar19 = getPageError;
            }
            pPVar12->xGet = pcVar19;
            __s->pPager = pPVar12;
            pPVar12->szMmap = local_e0->szMmap;
            pagerFixMaplimit(pPVar12);
            local_48 = 0;
            uStack_40 = 0;
            local_58 = 0;
            uStack_50 = 0;
            local_68 = 0;
            uStack_60 = 0;
            local_78 = 0;
            uStack_70 = 0;
            local_88 = 0;
            uStack_80 = 0;
            local_98 = 0;
            uStack_90 = 0;
            local_38 = 0;
            psVar3 = __s->pPager->fd;
            psVar2 = psVar3->pMethods;
            if (((psVar2 == (sqlite3_io_methods *)0x0) ||
                (uVar8 = (*psVar2->xRead)(psVar3,&local_98,100,0), uVar8 == 0x20a)) || (uVar8 == 0))
            {
              __s->openFlags = (u8)local_ec;
              __s->db = local_e0;
              pPVar12 = __s->pPager;
              pPVar12->xBusyHandler = btreeInvokeBusyHandler;
              pPVar12->pBusyHandlerArg = __s;
              psVar2 = pPVar12->fd->pMethods;
              if (psVar2 != (sqlite3_io_methods *)0x0) {
                (*psVar2->xFileControl)(pPVar12->fd,0xf,&pPVar12->xBusyHandler);
                pPVar12 = __s->pPager;
              }
              p->pBt = __s;
              __s->pCursor = (BtCursor *)0x0;
              __s->pPage1 = (MemPage *)0x0;
              if (pPVar12->readOnly != '\0') {
                *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
              }
              iVar7 = (int)((local_88 & 0xff) << 8);
              uVar8 = (uint)local_88._1_1_ * 0x10000 + iVar7;
              __s->pageSize = uVar8;
              if (((iVar7 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
                 ((uVar8 + 0x1ffff & uVar8) != 0)) {
                __s->pageSize = 0;
                uVar21 = 0;
                if (local_f8 != (char *)0x0 && (byte)local_cc == '\0') {
                  __s->autoVacuum = '\0';
                  __s->incrVacuum = '\0';
                  uVar21 = 0;
                }
              }
              else {
                uVar21 = (uint)local_88._4_1_;
                __s->btsFlags = __s->btsFlags | 2;
                __s->autoVacuum =
                     ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
                     (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
                __s->incrVacuum =
                     (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) ||
                     (local_58 & 0xff00) != 0) || (local_58 & 0xff) != 0;
              }
              uVar8 = sqlite3PagerSetPagesize(pPVar12,&__s->pageSize,uVar21);
              if (uVar8 == 0) {
                __s->usableSize = __s->pageSize - uVar21;
                __s->nRef = 1;
                if (p->sharable != '\0') {
                  if (sqlite3Config.bCoreMutex != '\0') {
                    psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                    if (sqlite3Config.bCoreMutex != '\0') {
                      psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                      __s->mutex = psVar15;
                      if (psVar15 == (sqlite3_mutex *)0x0) goto LAB_0012c7d3;
                    }
                    if (psVar14 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar14);
                      __s->pNext = sqlite3SharedCacheList;
                      sqlite3SharedCacheList = __s;
                      (*sqlite3Config.mutex.xMutexLeave)(psVar14);
                      goto LAB_0012c2ad;
                    }
                  }
                  __s->pNext = sqlite3SharedCacheList;
                  sqlite3SharedCacheList = __s;
                }
LAB_0012c2ad:
                if ((p->sharable != '\0') && (0 < (long)local_e0->nDb)) {
                  lVar22 = 0;
                  do {
                    pBVar27 = *(Btree **)((long)&local_e0->aDb->pBt + lVar22);
                    if ((pBVar27 != (Btree *)0x0) && (pBVar27->sharable != '\0')) goto LAB_0012c2f7;
                    lVar22 = lVar22 + 0x20;
                  } while ((long)local_e0->nDb * 0x20 != lVar22);
                }
                goto LAB_0012c841;
              }
            }
            goto LAB_0012c7d9;
          }
        }
      }
      psVar3 = pPVar12->fd;
      if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar3->pMethods->xClose)(psVar3);
        psVar3->pMethods = (sqlite3_io_methods *)0x0;
      }
      pcache1Free(pPVar12->pTmpSpace);
      sqlite3_free(pPVar12);
    }
    else {
      if (*local_f8 == '\0') {
        local_c8 = 1;
        local_e8 = 0;
        local_c0 = local_f8;
        goto LAB_0012bf38;
      }
      local_110 = sqlite3DbStrDup((sqlite3 *)0x0,local_f8);
      if (local_110 != (char *)0x0) {
        sVar10 = strlen(local_110);
        uVar21 = (uint)sVar10 & 0x3fffffff;
        uVar17 = (undefined7)(sVar10 >> 8);
        local_e8 = CONCAT71(uVar17,1);
        local_c0 = (char *)0x0;
        local_c8 = CONCAT71(uVar17,1);
        local_d8 = (char *)0x0;
        goto LAB_0012bf4c;
      }
LAB_0012c7d3:
      uVar8 = 7;
    }
LAB_0012c7d9:
    if (__s->pPager != (Pager *)0x0) {
      sqlite3PagerClose(__s->pPager,(sqlite3 *)0x0);
    }
  }
  sqlite3_free(__s);
  sqlite3_free(p);
  *local_b8 = (Btree *)0x0;
LAB_0012c80a:
  if (local_118 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_118);
  }
  return uVar8;
LAB_0012c1a0:
  __s = __s->pNext;
  if (__s == (BtShared *)0x0) goto code_r0x0012c1a9;
  goto LAB_0012c17b;
code_r0x0012c1a9:
  __s = (BtShared *)0x0;
LAB_0012c289:
  if (!bVar30) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar14);
  }
  sqlite3_free(pcVar28);
  if (__s == (BtShared *)0x0) goto LAB_0012bbd3;
  goto LAB_0012c2ad;
LAB_0012c2f7:
  do {
    pBVar23 = pBVar27;
    pBVar27 = pBVar23->pPrev;
  } while (pBVar23->pPrev != (Btree *)0x0);
  lVar22 = 0x20;
  if (p->pBt < pBVar23->pBt) {
    ppBVar18 = &pBVar23->pPrev;
    pBVar20 = (Btree *)0x0;
    pBVar27 = p;
  }
  else {
    do {
      pBVar26 = pBVar23;
      pBVar27 = pBVar26->pNext;
      if (pBVar27 == (Btree *)0x0) {
        ppBVar18 = &pBVar26->pNext;
        pBVar23 = (Btree *)0x0;
        pBVar20 = pBVar26;
        pBVar27 = p;
        goto LAB_0012c836;
      }
      pBVar23 = pBVar27;
    } while (pBVar27->pBt < p->pBt);
    ppBVar18 = &pBVar26->pNext;
    p->pNext = pBVar27;
    lVar22 = 0x28;
    pBVar20 = p;
    pBVar23 = pBVar26;
  }
LAB_0012c836:
  *(Btree **)((long)&p->db + lVar22) = pBVar23;
  pBVar27->pPrev = pBVar20;
  *ppBVar18 = p;
LAB_0012c841:
  *local_b8 = p;
  uVar8 = 0;
  pvVar16 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar16 == (void *)0x0) {
    sqlite3BtreeSetCacheSize(p,-2000);
  }
  psVar3 = __s->pPager->fd;
  psVar2 = psVar3->pMethods;
  if (psVar2 != (sqlite3_io_methods *)0x0) {
    (*psVar2->xFileControl)(psVar3,0x1e,&__s->db);
  }
  goto LAB_0012c80a;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          if( rc==SQLITE_OK_SYMLINK ){
            rc = SQLITE_OK;
          }else{
            sqlite3_free(zFullPathname);
            sqlite3_free(p);
            return rc;
          }
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );

    /* Suppress false-positive compiler warning from PVS-Studio */
    memset(&zDbHeader[16], 0, 8);

    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyHandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;

    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3BtreeSetCacheSize(p, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}